

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__getpwuid_r(uv_passwd_t *pwd,uid_t uid)

{
  int iVar1;
  char *__buffer;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sStack_88;
  int r;
  size_t gecos_size;
  size_t shell_size;
  size_t homedir_size;
  size_t name_size;
  size_t bufsize;
  char *buf;
  passwd *result;
  passwd pw;
  uid_t uid_local;
  uv_passwd_t *pwd_local;
  
  if (pwd == (uv_passwd_t *)0x0) {
    pwd_local._4_4_ = -0x16;
  }
  else {
    name_size = 2000;
    pw.pw_shell._4_4_ = uid;
    while (__buffer = (char *)uv__malloc(name_size), __buffer != (char *)0x0) {
      do {
        iVar1 = getpwuid_r(pw.pw_shell._4_4_,(passwd *)&result,__buffer,name_size,(passwd **)&buf);
      } while (iVar1 == 4);
      if ((iVar1 != 0) || (buf == (char *)0x0)) {
        uv__free(__buffer);
      }
      if (iVar1 != 0x22) {
        if (iVar1 != 0) {
          return -iVar1;
        }
        if (buf == (char *)0x0) {
          return -2;
        }
        sVar2 = strlen((char *)result);
        sVar2 = sVar2 + 1;
        sVar3 = strlen(pw.pw_gecos);
        sVar3 = sVar3 + 1;
        sVar4 = strlen(pw.pw_dir);
        sVar4 = sVar4 + 1;
        if (pw._16_8_ == 0) {
          sStack_88 = 0;
        }
        else {
          sStack_88 = strlen((char *)pw._16_8_);
          sStack_88 = sStack_88 + 1;
        }
        pcVar5 = (char *)uv__malloc(sVar2 + sVar3 + sVar4 + sStack_88);
        pwd->username = pcVar5;
        if (pwd->username == (char *)0x0) {
          uv__free(__buffer);
          return -0xc;
        }
        memcpy(pwd->username,result,sVar2);
        pwd->homedir = pwd->username + sVar2;
        memcpy(pwd->homedir,pw.pw_gecos,sVar3);
        pwd->shell = pwd->homedir + sVar3;
        memcpy(pwd->shell,pw.pw_dir,sVar4);
        if (pw._16_8_ == 0) {
          pwd->gecos = (char *)0x0;
        }
        else {
          pwd->gecos = pwd->shell + sVar4;
          memcpy(pwd->gecos,(void *)pw._16_8_,sStack_88);
        }
        pwd->uid = (ulong)(uint)pw.pw_passwd;
        pwd->gid = (ulong)pw.pw_passwd._4_4_;
        uv__free(__buffer);
        return 0;
      }
      name_size = name_size << 1;
    }
    pwd_local._4_4_ = -0xc;
  }
  return pwd_local._4_4_;
}

Assistant:

static int uv__getpwuid_r(uv_passwd_t *pwd, uid_t uid) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  size_t gecos_size;
  int r;

  if (pwd == NULL)
    return UV_EINVAL;

  /* Calling sysconf(_SC_GETPW_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getpwuid_r(uid, &pw, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the username, gecos, shell, and home directory. */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;

#ifdef __MVS__
  gecos_size = 0; /* pw_gecos does not exist on zOS. */
#else
  if (pw.pw_gecos != NULL)
    gecos_size = strlen(pw.pw_gecos) + 1;
  else
    gecos_size = 0;
#endif

  pwd->username = uv__malloc(name_size +
                             homedir_size +
                             shell_size +
                             gecos_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the gecos field */
#ifdef __MVS__
  pwd->gecos = NULL;  /* pw_gecos does not exist on zOS. */
#else
  if (pw.pw_gecos == NULL) {
    pwd->gecos = NULL;
  } else {
    pwd->gecos = pwd->shell + shell_size;
    memcpy(pwd->gecos, pw.pw_gecos, gecos_size);
  }
#endif

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}